

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_1522cf0::Target::DumpLinkCommandFragments
          (Value *__return_storage_ptr__,Target *this)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pBVar6;
  _Alloc_hider _Var7;
  undefined8 uVar8;
  cmLocalGenerator *this_00;
  cmGlobalGenerator *pcVar9;
  Value *extraout_RAX;
  Value *extraout_RAX_00;
  Value *pVVar10;
  char *role;
  pointer pBVar11;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> frag;
  ValueHolder local_190;
  pointer local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  undefined4 local_170;
  Value *local_168;
  undefined1 local_160 [40];
  undefined1 local_138 [32];
  string local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  Target *local_d8;
  Target *local_d0;
  __node_base local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  __buckets_ptr local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkLibs;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkPath;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkFlags;
  
  local_168 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  local_f8._8_8_ = 0;
  local_e8._M_local_buf[0] = '\0';
  linkFlags.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linkFlags.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkFlags.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  linkPath.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linkPath.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkPath.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkLibs.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linkLibs.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkLibs.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_allocated_capacity = (size_type)&local_e8;
  this_00 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  pcVar9 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_190,this_00);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&frag,(cmStateSnapshot *)&local_190);
  (*pcVar9->_vptr_cmGlobalGenerator[0x12])(&local_d0,pcVar9,this_00,&frag);
  role = (char *)&linkLibs;
  cmLocalGenerator::GetTargetFlags
            (this_00,(cmLinkLineComputer *)local_d0,this->Config,
             (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)role,(string *)&local_f8,&linkFlags,(string *)(local_138 + 0x20),&linkPath,this->GT)
  ;
  str._M_str = (char *)local_f8._M_allocated_capacity;
  str._M_len = local_f8._8_8_;
  cmTrimWhitespace_abi_cxx11_(&frag.Value,str);
  std::__cxx11::string::operator=((string *)local_f8._M_local_buf,(string *)&frag);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
    operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
  }
  str_00._M_str = local_118._M_dataplus._M_p;
  str_00._M_len = local_118._M_string_length;
  cmTrimWhitespace_abi_cxx11_(&frag.Value,str_00);
  std::__cxx11::string::operator=((string *)(local_138 + 0x20),(string *)&frag);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
    operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
  }
  uVar5 = local_f8._8_8_;
  uVar4 = local_f8._M_allocated_capacity;
  if (local_f8._8_8_ != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_allocated_capacity == &local_e8) {
      local_98._8_8_ = local_e8._8_8_;
      uVar8 = local_f8._M_allocated_capacity;
LAB_003ba471:
      local_f8._M_allocated_capacity = uVar8;
      local_190.string_ = (char *)&local_180;
      local_98._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
      local_98._M_local_buf[0] = local_e8._M_local_buf[0];
      local_180._M_allocated_capacity = local_98._M_allocated_capacity;
      local_180._8_4_ = local_98._8_4_;
      local_180._12_4_ = local_98._12_4_;
      role = (char *)uVar4;
    }
    else {
      local_180._M_allocated_capacity =
           CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
      uVar8 = &local_e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_allocated_capacity == &local_98) goto LAB_003ba471;
      local_190.map_ = (ObjectValues *)local_f8._M_allocated_capacity;
      role = (char *)local_180._M_allocated_capacity;
      local_f8._M_allocated_capacity = (size_type)&local_e8;
    }
    local_e8._M_local_buf[0] = '\0';
    local_f8._8_8_ = 0;
    local_188 = (pointer)uVar5;
    local_a0 = (__buckets_ptr)0x0;
    local_98._M_allocated_capacity = (ulong)(uint7)local_e8._M_allocated_capacity._1_7_ << 8;
    local_170 = 0xffffffff;
    local_160._0_8_ = local_160 + 0x10;
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"flags","");
    DumpCommandFragment((Value *)&frag,(Target *)&local_190,
                        (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_160,(string *)role);
    Json::Value::append(local_168,(Value *)&frag);
    Json::Value::~Value((Value *)&frag);
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190.string_,(ulong)(local_180._M_allocated_capacity + 1));
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98._M_allocated_capacity + 1);
    }
  }
  pBVar6 = linkFlags.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d8 = this;
  if (linkFlags.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      linkFlags.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar11 = linkFlags.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      frag.Value._M_dataplus._M_p = (pointer)&frag.Value.field_2;
      pcVar1 = (pBVar11->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&frag,pcVar1,pcVar1 + (pBVar11->Value)._M_string_length);
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (pBVar11->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (pBVar11->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        role = &__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      str_01._M_str = frag.Value._M_dataplus._M_p;
      str_01._M_len = frag.Value._M_string_length;
      cmTrimWhitespace_abi_cxx11_((string *)&local_190,str_01);
      std::__cxx11::string::operator=((string *)&frag,(string *)&local_190.bool_);
      if (local_190 != &local_180) {
        operator_delete(local_190.string_,(ulong)(local_180._M_allocated_capacity + 1));
      }
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160,local_d8,&frag);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"flags","");
      DumpCommandFragment((Value *)&local_190,(Target *)local_160,
                          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_138,(string *)role);
      Json::Value::append(local_168,(Value *)&local_190);
      Json::Value::~Value((Value *)&local_190);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
        operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
      }
      pBVar11 = pBVar11 + 1;
    } while (pBVar11 != pBVar6);
  }
  sVar3 = local_118._M_string_length;
  _Var2._M_p = local_118._M_dataplus._M_p;
  if ((pointer)local_118._M_string_length == (pointer)0x0) goto LAB_003ba849;
  _Var7._M_p = (pointer)&local_118.field_2;
  if (local_118._M_dataplus._M_p == _Var7._M_p) {
    local_b8._8_8_ = local_118.field_2._8_8_;
    _Var7._M_p = local_118._M_dataplus._M_p;
LAB_003ba77e:
    local_118._M_dataplus._M_p = _Var7._M_p;
    local_190.string_ = (char *)&local_180;
    local_b8._M_allocated_capacity._1_7_ = local_118.field_2._M_allocated_capacity._1_7_;
    local_b8._M_local_buf[0] = local_118.field_2._M_local_buf[0];
    local_180._M_allocated_capacity = local_b8._M_allocated_capacity;
    local_180._8_4_ = local_b8._8_4_;
    local_180._12_4_ = local_b8._12_4_;
    role = _Var2._M_p;
  }
  else {
    local_180._M_allocated_capacity =
         CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,local_118.field_2._M_local_buf[0]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_b8) goto LAB_003ba77e;
    local_190.map_ = (ObjectValues *)local_118._M_dataplus._M_p;
    role = (char *)local_180._M_allocated_capacity;
    local_118._M_dataplus._M_p = _Var7._M_p;
  }
  local_118.field_2._M_local_buf[0] = '\0';
  local_118._M_string_length = 0;
  local_188 = (pointer)sVar3;
  local_c0 = 0;
  local_b8._M_allocated_capacity = (ulong)(uint7)local_118.field_2._M_allocated_capacity._1_7_ << 8;
  local_170 = 0xffffffff;
  local_160._0_8_ = local_160 + 0x10;
  local_c8._M_nxt = (_Hash_node_base *)&local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"frameworkPath","");
  DumpCommandFragment((Value *)&frag,(Target *)&local_190,
                      (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_160,(string *)role);
  Json::Value::append(local_168,(Value *)&frag);
  Json::Value::~Value((Value *)&frag);
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190.string_,(ulong)(local_180._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_nxt != &local_b8) {
    operator_delete(local_c8._M_nxt,local_b8._M_allocated_capacity + 1);
  }
LAB_003ba849:
  pBVar6 = linkPath.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (linkPath.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      linkPath.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar11 = linkPath.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      frag.Value._M_dataplus._M_p = (pointer)&frag.Value.field_2;
      pcVar1 = (pBVar11->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&frag,pcVar1,pcVar1 + (pBVar11->Value)._M_string_length);
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (pBVar11->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (pBVar11->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        role = &__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      str_02._M_str = frag.Value._M_dataplus._M_p;
      str_02._M_len = frag.Value._M_string_length;
      cmTrimWhitespace_abi_cxx11_((string *)&local_190,str_02);
      std::__cxx11::string::operator=((string *)&frag,(string *)&local_190.bool_);
      if (local_190 != &local_180) {
        operator_delete(local_190.string_,(ulong)(local_180._M_allocated_capacity + 1));
      }
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160,local_d8,&frag);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"libraryPath","");
      DumpCommandFragment((Value *)&local_190,(Target *)local_160,
                          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_138,(string *)role);
      Json::Value::append(local_168,(Value *)&local_190);
      Json::Value::~Value((Value *)&local_190);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
        operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
      }
      pBVar11 = pBVar11 + 1;
    } while (pBVar11 != pBVar6);
  }
  pBVar6 = linkLibs.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (linkLibs.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      linkLibs.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar11 = linkLibs.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      frag.Value._M_dataplus._M_p = (pointer)&frag.Value.field_2;
      pcVar1 = (pBVar11->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&frag,pcVar1,pcVar1 + (pBVar11->Value)._M_string_length);
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (pBVar11->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (pBVar11->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        role = &__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      str_03._M_str = frag.Value._M_dataplus._M_p;
      str_03._M_len = frag.Value._M_string_length;
      cmTrimWhitespace_abi_cxx11_((string *)&local_190,str_03);
      std::__cxx11::string::operator=((string *)&frag,(string *)&local_190.bool_);
      if (local_190 != &local_180) {
        operator_delete(local_190.string_,(ulong)(local_180._M_allocated_capacity + 1));
      }
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160,local_d8,&frag);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"libraries","");
      DumpCommandFragment((Value *)&local_190,(Target *)local_160,
                          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_138,(string *)role);
      Json::Value::append(local_168,(Value *)&local_190);
      Json::Value::~Value((Value *)&local_190);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
        operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
      }
      pBVar11 = pBVar11 + 1;
    } while (pBVar11 != pBVar6);
  }
  if (local_d0 != (Target *)0x0) {
    (*(code *)local_d0->GT->Makefile)();
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&linkLibs);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&linkPath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&linkFlags);
  pVVar10 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_allocated_capacity != &local_e8) {
    operator_delete((void *)local_f8._M_allocated_capacity,
                    CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1);
    pVVar10 = extraout_RAX_00;
  }
  return pVVar10;
}

Assistant:

Json::Value Target::DumpLinkCommandFragments()
{
  Json::Value linkFragments = Json::arrayValue;

  std::string linkLanguageFlags;
  std::vector<BT<std::string>> linkFlags;
  std::string frameworkPath;
  std::vector<BT<std::string>> linkPath;
  std::vector<BT<std::string>> linkLibs;
  cmLocalGenerator* lg = this->GT->GetLocalGenerator();
  cmGlobalGenerator* gg = this->GT->GetGlobalGenerator();
  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    gg->CreateLinkLineComputer(lg, lg->GetStateSnapshot().GetDirectory());
  lg->GetTargetFlags(linkLineComputer.get(), this->Config, linkLibs,
                     linkLanguageFlags, linkFlags, frameworkPath, linkPath,
                     this->GT);
  linkLanguageFlags = cmTrimWhitespace(linkLanguageFlags);
  frameworkPath = cmTrimWhitespace(frameworkPath);

  if (!linkLanguageFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLanguageFlags), "flags"));
  }

  if (!linkFlags.empty()) {
    for (BT<std::string> frag : linkFlags) {
      frag.Value = cmTrimWhitespace(frag.Value);
      linkFragments.append(
        this->DumpCommandFragment(this->ToJBT(frag), "flags"));
    }
  }

  if (!frameworkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(frameworkPath), "frameworkPath"));
  }

  if (!linkPath.empty()) {
    for (BT<std::string> frag : linkPath) {
      frag.Value = cmTrimWhitespace(frag.Value);
      linkFragments.append(
        this->DumpCommandFragment(this->ToJBT(frag), "libraryPath"));
    }
  }

  if (!linkLibs.empty()) {
    for (BT<std::string> frag : linkLibs) {
      frag.Value = cmTrimWhitespace(frag.Value);
      linkFragments.append(
        this->DumpCommandFragment(this->ToJBT(frag), "libraries"));
    }
  }

  return linkFragments;
}